

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandMap(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pNtk_00;
  char *pcVar5;
  float fVar6;
  double dVar7;
  uint local_f0;
  int c;
  int fVerbose;
  int fUseBuffs;
  int fUseProfile;
  int fSkipFanout;
  int fSwitching;
  int fSweep;
  int fRecovery;
  int fAreaOnly;
  int nGatesMin;
  float Gain;
  float Slew;
  float LogFan;
  double DelayMulti;
  double AreaMulti;
  double DelayTarget;
  char Buffer [100];
  Abc_Ntk_t *local_38;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Gain = 0.0;
  nGatesMin = 0;
  fAreaOnly = 0x437a0000;
  fRecovery = 0;
  pAVar4 = Abc_FrameReadNtk(pAbc);
  AreaMulti = -1.0;
  DelayMulti = 0.0;
  _Slew = 0.0;
  bVar1 = false;
  fSwitching = 1;
  bVar2 = false;
  fUseProfile = 0;
  fUseBuffs = 0;
  fVerbose = 0;
  c = 0;
  local_f0 = 0;
  Extra_UtilGetoptReset();
LAB_0027fd10:
  iVar3 = Extra_UtilGetopt(argc,argv,"DABFSGMarspfuovh");
  if (iVar3 == -1) {
    if (pAVar4 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    if (bVar1) {
      AreaMulti = 1000000000.0;
    }
    iVar3 = Abc_NtkIsStrash(pAVar4);
    if (iVar3 == 0) {
      pAVar4 = Abc_NtkStrash(pAVar4,0,0,0);
      if (pAVar4 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Strashing before mapping has failed.\n");
        return 1;
      }
      pNtk_00 = Abc_NtkBalance(pAVar4,0,0,1);
      Abc_NtkDelete(pAVar4);
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Balancing before mapping has failed.\n");
        return 1;
      }
      Abc_Print(0,"The network was strashed and balanced before mapping.\n");
      local_38 = Abc_NtkMap(pNtk_00,AreaMulti,DelayMulti,_Slew,Gain,(float)nGatesMin,
                            (float)fAreaOnly,fRecovery,fSwitching,fUseProfile,fUseBuffs,fVerbose,c,
                            local_f0);
      if (local_38 == (Abc_Ntk_t *)0x0) {
        Abc_NtkDelete(pNtk_00);
        Abc_Print(-1,"Mapping has failed.\n");
        return 1;
      }
      Abc_NtkDelete(pNtk_00);
    }
    else {
      local_38 = Abc_NtkMap(pAVar4,AreaMulti,DelayMulti,_Slew,Gain,(float)nGatesMin,(float)fAreaOnly
                            ,fRecovery,fSwitching,fUseProfile,fUseBuffs,fVerbose,c,local_f0);
      if (local_38 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Mapping has failed.\n");
        return 1;
      }
    }
    if (bVar2) {
      Abc_NtkFraigSweep(local_38,0,0,0,0);
      iVar3 = Abc_NtkHasMapping(local_38);
      if (iVar3 != 0) {
        pAVar4 = Abc_NtkDupDfs(local_38);
        Abc_NtkDelete(local_38);
        local_38 = pAVar4;
      }
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,local_38);
    return 0;
  }
  switch(iVar3) {
  case 0x41:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-A\" should be followed by a floating point number.\n");
      goto LAB_002803b4;
    }
    dVar7 = atof(argv[globalUtilOptind]);
    DelayMulti = (double)(float)dVar7;
    globalUtilOptind = globalUtilOptind + 1;
    goto LAB_0027fd10;
  case 0x42:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-B\" should be followed by a floating point number.\n");
      goto LAB_002803b4;
    }
    dVar7 = atof(argv[globalUtilOptind]);
    _Slew = (double)(float)dVar7;
    globalUtilOptind = globalUtilOptind + 1;
    goto LAB_0027fd10;
  default:
    goto LAB_002803b4;
  case 0x44:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by a floating point number.\n");
      goto LAB_002803b4;
    }
    dVar7 = atof(argv[globalUtilOptind]);
    AreaMulti = (double)(float)dVar7;
    globalUtilOptind = globalUtilOptind + 1;
    if (AreaMulti <= 0.0) goto LAB_002803b4;
    goto LAB_0027fd10;
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by a floating point number.\n");
      goto LAB_002803b4;
    }
    dVar7 = atof(argv[globalUtilOptind]);
    Gain = (float)dVar7;
    globalUtilOptind = globalUtilOptind + 1;
    if (Gain < 0.0) goto LAB_002803b4;
    goto LAB_0027fd10;
  case 0x47:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-G\" should be followed by a floating point number.\n");
      goto LAB_002803b4;
    }
    dVar7 = atof(argv[globalUtilOptind]);
    fAreaOnly = (int)(float)dVar7;
    fVar6 = (float)fAreaOnly;
    break;
  case 0x4d:
    if (globalUtilOptind < argc) goto LAB_00280048;
    Abc_Print(-1,"Command line switch \"-M\" should be followed by a positive integer.\n");
    goto LAB_002803b4;
  case 0x53:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-S\" should be followed by a floating point number.\n");
      goto LAB_002803b4;
    }
    dVar7 = atof(argv[globalUtilOptind]);
    nGatesMin = (int)(float)dVar7;
    fVar6 = (float)nGatesMin;
    break;
  case 0x61:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_0027fd10;
  case 0x66:
    fUseBuffs = fUseBuffs ^ 1;
    goto LAB_0027fd10;
  case 0x68:
    goto LAB_002803b4;
  case 0x6f:
    c = c ^ 1;
    goto LAB_0027fd10;
  case 0x70:
    fUseProfile = fUseProfile ^ 1;
    goto LAB_0027fd10;
  case 0x72:
    fSwitching = fSwitching ^ 1;
    goto LAB_0027fd10;
  case 0x73:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_0027fd10;
  case 0x75:
    fVerbose = fVerbose ^ 1;
    goto LAB_0027fd10;
  case 0x76:
    local_f0 = local_f0 ^ 1;
    goto LAB_0027fd10;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if (fVar6 <= 0.0) goto LAB_002803b4;
  goto LAB_0027fd10;
LAB_00280048:
  fRecovery = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if (fRecovery < 0) {
LAB_002803b4:
    if ((AreaMulti != -1.0) || (NAN(AreaMulti))) {
      sprintf((char *)&DelayTarget,"%.3f",AreaMulti);
    }
    else {
      sprintf((char *)&DelayTarget,"not used");
    }
    Abc_Print(-2,"usage: map [-DABFSG float] [-M num] [-arspfuovh]\n");
    Abc_Print(-2,"\t           performs standard cell mapping of the current network\n");
    Abc_Print(-2,"\t-D float : sets the global required times [default = %s]\n",&DelayTarget);
    Abc_Print(-2,"\t-A float : \"area multiplier\" to bias gate selection [default = %.2f]\n",
              DelayMulti);
    Abc_Print(-2,"\t-B float : \"delay multiplier\" to bias gate selection [default = %.2f]\n",_Slew
             );
    Abc_Print(-2,"\t-F float : the logarithmic fanout delay parameter [default = %.2f]\n",
              (double)Gain);
    Abc_Print(-2,"\t-S float : the slew parameter used to generate the library [default = %.2f]\n",
              (double)(float)nGatesMin);
    Abc_Print(-2,"\t-G float : the gain parameter used to generate the library [default = %.2f]\n",
              (double)(float)fAreaOnly);
    Abc_Print(-2,"\t-M num   : skip gate classes whose size is less than this [default = %d]\n",
              (ulong)(uint)fRecovery);
    pcVar5 = "no";
    if (bVar1) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-a       : toggles area-only mapping [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (fSwitching != 0) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-r       : toggles area recovery [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (bVar2) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-s       : toggles sweep after mapping [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (fUseProfile != 0) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-p       : optimizes power by minimizing switching [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (fUseBuffs != 0) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-f       : do not use large gates to map high-fanout nodes [default = %s]\n",
              pcVar5);
    pcVar5 = "no";
    if (fVerbose != 0) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-u       : use standard-cell profile [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (c != 0) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,
              "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n"
              ,pcVar5);
    pcVar5 = "no";
    if (local_f0 != 0) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar5);
    Abc_Print(-2,"\t-h       : print the command usage\n");
    return 1;
  }
  goto LAB_0027fd10;
}

Assistant:

int Abc_CommandMap( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    char Buffer[100];
    double DelayTarget;
    double AreaMulti;
    double DelayMulti;
    float LogFan = 0;
    float Slew = 0; // choose based on the library
    float Gain = 250;
    int nGatesMin = 0;
    int fAreaOnly;
    int fRecovery;
    int fSweep;
    int fSwitching;
    int fSkipFanout;
    int fUseProfile;
    int fUseBuffs;
    int fVerbose;
    int c;
    extern Abc_Ntk_t * Abc_NtkMap( Abc_Ntk_t * pNtk, double DelayTarget, double AreaMulti, double DelayMulti, float LogFan, float Slew, float Gain, int nGatesMin, int fRecovery, int fSwitching, int fSkipFanout, int fUseProfile, int fUseBuffs, int fVerbose );
    extern int Abc_NtkFraigSweep( Abc_Ntk_t * pNtk, int fUseInv, int fExdc, int fVerbose, int fVeryVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    DelayTarget =-1;
    AreaMulti   = 0;
    DelayMulti  = 0;
    fAreaOnly   = 0;
    fRecovery   = 1;
    fSweep      = 0;
    fSwitching  = 0;
    fSkipFanout = 0;
    fUseProfile = 0;
    fUseBuffs   = 0;
    fVerbose    = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "DABFSGMarspfuovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            DelayTarget = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a floating point number.\n" );
                goto usage;
            }
            AreaMulti = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by a floating point number.\n" );
                goto usage;
            }
            DelayMulti = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a floating point number.\n" );
                goto usage;
            }
            LogFan = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( LogFan < 0.0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Slew = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Slew <= 0.0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Gain = (float)atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Gain <= 0.0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nGatesMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nGatesMin < 0 )
                goto usage;
            break;
        case 'a':
            fAreaOnly ^= 1;
            break;
        case 'r':
            fRecovery ^= 1;
            break;
        case 's':
            fSweep ^= 1;
            break;
        case 'p':
            fSwitching ^= 1;
            break;
        case 'f':
            fSkipFanout ^= 1;
            break;
        case 'u':
            fUseProfile ^= 1;
            break;
        case 'o':
            fUseBuffs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fAreaOnly )
        DelayTarget = ABC_INFINITY;

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Strashing before mapping has failed.\n" );
            return 1;
        }
        pNtk = Abc_NtkBalance( pNtkRes = pNtk, 0, 0, 1 );
        Abc_NtkDelete( pNtkRes );
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Balancing before mapping has failed.\n" );
            return 1;
        }
        Abc_Print( 0, "The network was strashed and balanced before mapping.\n" );
        // get the new network
        pNtkRes = Abc_NtkMap( pNtk, DelayTarget, AreaMulti, DelayMulti, LogFan, Slew, Gain, nGatesMin, fRecovery, fSwitching, fSkipFanout, fUseProfile, fUseBuffs, fVerbose );
        if ( pNtkRes == NULL )
        {
            Abc_NtkDelete( pNtk );
            Abc_Print( -1, "Mapping has failed.\n" );
            return 1;
        }
        Abc_NtkDelete( pNtk );
    }
    else
    {
        // get the new network
        pNtkRes = Abc_NtkMap( pNtk, DelayTarget, AreaMulti, DelayMulti, LogFan, Slew, Gain, nGatesMin, fRecovery, fSwitching, fSkipFanout, fUseProfile, fUseBuffs, fVerbose );
        if ( pNtkRes == NULL )
        {
            Abc_Print( -1, "Mapping has failed.\n" );
            return 1;
        }
    }

    if ( fSweep )
    {
        Abc_NtkFraigSweep( pNtkRes, 0, 0, 0, 0 );
        if ( Abc_NtkHasMapping(pNtkRes) )
        {
            pNtkRes = Abc_NtkDupDfs( pNtk = pNtkRes );
            Abc_NtkDelete( pNtk );
        }
    }

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    if ( DelayTarget == -1 )
        sprintf(Buffer, "not used" );
    else
        sprintf(Buffer, "%.3f", DelayTarget );
    Abc_Print( -2, "usage: map [-DABFSG float] [-M num] [-arspfuovh]\n" );
    Abc_Print( -2, "\t           performs standard cell mapping of the current network\n" );
    Abc_Print( -2, "\t-D float : sets the global required times [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-A float : \"area multiplier\" to bias gate selection [default = %.2f]\n", AreaMulti );
    Abc_Print( -2, "\t-B float : \"delay multiplier\" to bias gate selection [default = %.2f]\n", DelayMulti );
    Abc_Print( -2, "\t-F float : the logarithmic fanout delay parameter [default = %.2f]\n", LogFan );
    Abc_Print( -2, "\t-S float : the slew parameter used to generate the library [default = %.2f]\n", Slew );
    Abc_Print( -2, "\t-G float : the gain parameter used to generate the library [default = %.2f]\n", Gain );
    Abc_Print( -2, "\t-M num   : skip gate classes whose size is less than this [default = %d]\n", nGatesMin );
    Abc_Print( -2, "\t-a       : toggles area-only mapping [default = %s]\n", fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggles area recovery [default = %s]\n", fRecovery? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggles sweep after mapping [default = %s]\n", fSweep? "yes": "no" );
    Abc_Print( -2, "\t-p       : optimizes power by minimizing switching [default = %s]\n", fSwitching? "yes": "no" );
    Abc_Print( -2, "\t-f       : do not use large gates to map high-fanout nodes [default = %s]\n", fSkipFanout? "yes": "no" );
    Abc_Print( -2, "\t-u       : use standard-cell profile [default = %s]\n", fUseProfile? "yes": "no" );
    Abc_Print( -2, "\t-o       : toggles using buffers to decouple combinational outputs [default = %s]\n", fUseBuffs? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}